

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O2

void __thiscall parse_util::ParseExc::ParseExc(ParseExc *this,string *where,string *par)

{
  ostream *poVar1;
  stringstream ss;
  string local_1d0 [32];
  runtime_error local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"");
  *(undefined ***)this = &PTR__runtime_error_0016fd58;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Parse error: in ");
  poVar1 = std::operator<<(poVar1,(string *)where);
  poVar1 = std::operator<<(poVar1," param(s) ");
  poVar1 = std::operator<<(poVar1,(string *)par);
  std::operator<<(poVar1," is unknown");
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(local_1b0,local_1d0);
  std::runtime_error::operator=(&this->super_runtime_error,local_1b0);
  std::runtime_error::~runtime_error(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

ParseExc::ParseExc(const string &where, const string &par) :
        std::runtime_error("")
    {
        std::stringstream ss;
        ss << "Parse error: in " << where << " param(s) " << par << " is unknown";
        static_cast<std::runtime_error&>(*this) = std::runtime_error(ss.str());
    }